

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_visualization.cpp
# Opt level: O0

void __thiscall lumeview::SubsetVisualization::prepare_renderer(SubsetVisualization *this)

{
  bool bVar1;
  reference psVar2;
  size_t sVar3;
  element_type *peVar4;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 aVar5;
  GrobSet local_11c;
  shared_ptr<lume::Mesh> local_118;
  allocator local_101;
  string local_100 [36];
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_dc;
  GrobSet local_cc;
  shared_ptr<lume::Mesh> local_c8;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [32];
  GrobSet local_68 [5];
  value_type_conflict1 local_54;
  undefined1 local_50 [8];
  shared_ptr<lume::Mesh> mesh;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_> *__range1;
  undefined1 local_20 [4];
  index_t subsetIndex;
  vec4 wireColor;
  SubsetVisualization *this_local;
  
  wireColor.field_0._8_8_ = this;
  glm::tvec4<float,_(glm::precision)0>::tvec4
            ((tvec4<float,_(glm::precision)0> *)local_20,0.2,0.2,0.2,1.0);
  __range1._4_4_ = 0;
  std::vector<int,_std::allocator<int>_>::clear(&this->m_subsetIndexToStageIndex);
  __end1 = std::vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>::
           begin(&this->m_subsetMeshes);
  mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>::end
                 (&this->m_subsetMeshes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<lume::Mesh>_*,_std::vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>_>
                                *)&mesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar2 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<lume::Mesh>_*,_std::vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<lume::Mesh>::shared_ptr((shared_ptr<lume::Mesh> *)local_50,psVar2);
    sVar3 = Renderer::num_stages(&this->m_renderer);
    local_54 = (value_type_conflict1)sVar3;
    std::vector<int,_std::allocator<int>_>::push_back(&this->m_subsetIndexToStageIndex,&local_54);
    peVar4 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )local_50);
    lume::GrobSet::GrobSet(local_68,FACES);
    bVar1 = lume::Mesh::has(peVar4,local_68[0]);
    if (bVar1) {
      peVar4 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"normals",&local_89);
      lume::ComputeFaceVertexNormals3(peVar4,(string *)local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      peVar4 = std::__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*((__shared_ptr_access<lume::Mesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_50);
      lume::CreateSideGrobs(peVar4,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"solid",&local_b1);
      std::shared_ptr<lume::Mesh>::shared_ptr(&local_c8,(shared_ptr<lume::Mesh> *)local_50);
      lume::GrobSet::GrobSet(&local_cc,FACES);
      Renderer::add_stage(&this->m_renderer,(string *)local_b0,&local_c8,local_cc,FLAT);
      std::shared_ptr<lume::Mesh>::~shared_ptr(&local_c8);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      aVar5.field_0 =
           (anon_struct_16_4_d86d922e_for_anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2_0
            )subset_color(this,__range1._4_4_);
      local_dc.field_0 = aVar5.field_0;
      Renderer::stage_set_color(&this->m_renderer,(vec4 *)&local_dc.field_0,-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_100,"wire",&local_101);
      std::shared_ptr<lume::Mesh>::shared_ptr(&local_118,(shared_ptr<lume::Mesh> *)local_50);
      lume::GrobSet::GrobSet(&local_11c,EDGES);
      Renderer::add_stage(&this->m_renderer,(string *)local_100,&local_118,local_11c,FLAT);
      std::shared_ptr<lume::Mesh>::~shared_ptr(&local_118);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      Renderer::stage_set_color(&this->m_renderer,(vec4 *)local_20,-1);
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    std::shared_ptr<lume::Mesh>::~shared_ptr((shared_ptr<lume::Mesh> *)local_50);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<lume::Mesh>_*,_std::vector<std::shared_ptr<lume::Mesh>,_std::allocator<std::shared_ptr<lume::Mesh>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SubsetVisualization::prepare_renderer ()
{
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);

	index_t subsetIndex = 0;
	m_subsetIndexToStageIndex.clear ();
	for(auto mesh : m_subsetMeshes) {

		m_subsetIndexToStageIndex.push_back ((int)m_renderer.num_stages());

		if (mesh->has (FACES)) {
			ComputeFaceVertexNormals3 (*mesh, "normals");
			CreateSideGrobs (*mesh, 1);

			m_renderer.add_stage ("solid", mesh, FACES, FLAT);
			m_renderer.stage_set_color (subset_color (subsetIndex));

			m_renderer.add_stage ("wire", mesh, EDGES, FLAT);
			m_renderer.stage_set_color (wireColor);
		}
		++subsetIndex;
	}
}